

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agc.c
# Opt level: O0

int32_t WebRtcAgc_ProcessAnalog
                  (void *state,int32_t inMicLevel,int32_t *outMicLevel,int16_t vadLogRatio,
                  int16_t echo,uint8_t *saturationWarning)

{
  short sVar1;
  short sVar2;
  int local_74;
  int32_t local_70;
  int32_t local_6c;
  int16_t local_68;
  short local_64;
  int16_t local_62;
  int16_t volNormFIX_1;
  int16_t weightFIX_1;
  int16_t index_1;
  int16_t volNormFIX;
  int16_t weightFIX;
  int16_t index;
  int32_t tmpVol;
  LegacyAgc *stt;
  uint8_t saturated;
  int32_t iStack_48;
  int16_t i;
  int32_t lastMicVol;
  int32_t inMicLevelTmp;
  int32_t tmp32;
  int32_t Rxx16w32;
  uint32_t tmpU32;
  uint8_t *saturationWarning_local;
  int16_t echo_local;
  int32_t *piStack_28;
  int16_t vadLogRatio_local;
  int32_t *outMicLevel_local;
  void *pvStack_18;
  int32_t inMicLevel_local;
  void *state_local;
  
  stt._1_1_ = '\0';
  iStack_48 = inMicLevel << ((byte)*(undefined2 *)((long)state + 0x15c) & 0x1f);
  if (*(int *)((long)state + 0x144) < iStack_48) {
    state_local._4_4_ = -1;
  }
  else if (iStack_48 < *(int *)((long)state + 0x14c)) {
    state_local._4_4_ = -1;
  }
  else {
    if (*(short *)((long)state + 0x122) == 0) {
      *(undefined2 *)((long)state + 0x122) = 1;
      lastMicVol = (*(int *)((long)state + 0x140) - *(int *)((long)state + 0x14c)) * 0x33 >> 9;
      _index_1 = *(int *)((long)state + 0x14c) + lastMicVol;
      if ((iStack_48 < _index_1) && (*(short *)((long)state + 8) == 1)) {
        iStack_48 = _index_1;
      }
      *(int32_t *)((long)state + 0x13c) = iStack_48;
    }
    if ((iStack_48 == *(int *)((long)state + 0x144)) &&
       (*(int *)((long)state + 0x144) < *(int *)((long)state + 0x13c))) {
      iStack_48 = *(int *)((long)state + 0x13c);
    }
    if ((iStack_48 != *(int *)((long)state + 0x13c)) && (iStack_48 < *(int *)((long)state + 0x150)))
    {
      lastMicVol = (*(int *)((long)state + 0x140) - *(int *)((long)state + 0x14c)) * 0x33 >> 9;
      iStack_48 = *(int *)((long)state + 0x14c) + lastMicVol;
      *(int32_t *)((long)state + 0x13c) = iStack_48;
    }
    if (iStack_48 != *(int *)((long)state + 0x13c)) {
      if (inMicLevel == *(int *)((long)state + 0x158)) {
        iStack_48 = *(int *)((long)state + 0x13c);
      }
      else {
        *(int32_t *)((long)state + 0x13c) = iStack_48;
      }
    }
    if (*(int *)((long)state + 0x140) < iStack_48) {
      *(int32_t *)((long)state + 0x140) = iStack_48;
    }
    *(int32_t *)((long)state + 0x158) = inMicLevel;
    stt._4_4_ = *(int *)((long)state + 0x13c);
    _weightFIX = (LegacyAgc *)state;
    _Rxx16w32 = saturationWarning;
    saturationWarning_local._4_2_ = echo;
    saturationWarning_local._6_2_ = vadLogRatio;
    piStack_28 = outMicLevel;
    outMicLevel_local._4_4_ = inMicLevel;
    pvStack_18 = state;
    WebRtcAgc_SaturationCtrl
              ((LegacyAgc *)state,(uint8_t *)((long)&stt + 1),(int32_t *)((long)state + 0xc4));
    if (stt._1_1_ == '\x01') {
      _weightFIX->Rxx160_LPw32 = (_weightFIX->Rxx160_LPw32 / 8) * 7;
      _weightFIX->zeroCtrlMax = _weightFIX->micVol;
      lastMicVol = iStack_48 - _weightFIX->minLevel;
      tmp32 = lastMicVol * 0x7397;
      _weightFIX->micVol = ((uint)tmp32 >> 0xf) + _weightFIX->minLevel;
      if (stt._4_4_ + -2 < _weightFIX->micVol) {
        _weightFIX->micVol = stt._4_4_ + -2;
      }
      iStack_48 = _weightFIX->micVol;
      if (_weightFIX->micVol < _weightFIX->minOutput) {
        *_Rxx16w32 = '\x01';
      }
      _weightFIX->msTooHigh = -100;
      _weightFIX->activeSpeech = 0;
      _weightFIX->Rxx16_LPw32Max = 0;
      _weightFIX->msecSpeechInnerChange = 0x208;
      _weightFIX->msecSpeechOuterChange = 0x154;
      _weightFIX->changeToSlowMode = 0;
      _weightFIX->muteGuardMs = 0;
      _weightFIX->upperLimit = _weightFIX->startUpperLimit;
      _weightFIX->lowerLimit = _weightFIX->startLowerLimit;
    }
    WebRtcAgc_ZeroCtrl(_weightFIX,&stack0xffffffffffffffb8,_weightFIX->env[0]);
    WebRtcAgc_SpeakerInactiveCtrl(_weightFIX);
    for (stt._2_2_ = 0; stt._2_2_ < 5; stt._2_2_ = stt._2_2_ + 1) {
      inMicLevelTmp = _weightFIX->Rxx16w32_array[0][stt._2_2_];
      _weightFIX->Rxx160w32 =
           _weightFIX->Rxx160w32 +
           (inMicLevelTmp - _weightFIX->Rxx16_vectorw32[_weightFIX->Rxx16pos] >> 3);
      _weightFIX->Rxx16_vectorw32[_weightFIX->Rxx16pos] = inMicLevelTmp;
      _weightFIX->Rxx16pos = _weightFIX->Rxx16pos + 1;
      if (_weightFIX->Rxx16pos == 10) {
        _weightFIX->Rxx16pos = 0;
      }
      _weightFIX->Rxx16_LPw32 =
           _weightFIX->Rxx16_LPw32 + (inMicLevelTmp - _weightFIX->Rxx16_LPw32 >> 6);
      if (_weightFIX->vadThreshold < saturationWarning_local._6_2_) {
        if (_weightFIX->activeSpeech < 0xfa) {
          _weightFIX->activeSpeech = _weightFIX->activeSpeech + 2;
          if (_weightFIX->Rxx16_LPw32Max < _weightFIX->Rxx16_LPw32) {
            _weightFIX->Rxx16_LPw32Max = _weightFIX->Rxx16_LPw32;
          }
        }
        else if (_weightFIX->activeSpeech == 0xfa) {
          _weightFIX->activeSpeech = _weightFIX->activeSpeech + 2;
          _weightFIX->Rxx160_LPw32 = (_weightFIX->Rxx16_LPw32Max >> 3) * 10;
        }
        _weightFIX->Rxx160_LPw32 =
             _weightFIX->Rxx160_LPw32 + (_weightFIX->Rxx160w32 - _weightFIX->Rxx160_LPw32 >> 10);
        if (_weightFIX->upperSecondaryLimit < _weightFIX->Rxx160_LPw32) {
          _weightFIX->msTooHigh = _weightFIX->msTooHigh + 2;
          _weightFIX->msTooLow = 0;
          _weightFIX->changeToSlowMode = 0;
          if (_weightFIX->msecSpeechOuterChange < _weightFIX->msTooHigh) {
            _weightFIX->msTooHigh = 0;
            _weightFIX->Rxx160_LPw32 = (_weightFIX->Rxx160_LPw32 >> 6) * 0x35;
            _weightFIX->maxLevel = (_weightFIX->maxLevel * 0xf + _weightFIX->micVol) / 0x10;
            if (_weightFIX->maxAnalog < _weightFIX->maxLevel) {
              local_6c = _weightFIX->maxLevel;
            }
            else {
              local_6c = _weightFIX->maxAnalog;
            }
            _weightFIX->maxLevel = local_6c;
            _weightFIX->zeroCtrlMax = _weightFIX->micVol;
            tmp32 = (iStack_48 - _weightFIX->minLevel) * 0x799a;
            _weightFIX->micVol = ((uint)tmp32 >> 0xf) + _weightFIX->minLevel;
            if (stt._4_4_ + -1 < _weightFIX->micVol) {
              _weightFIX->micVol = stt._4_4_ + -1;
            }
            iStack_48 = _weightFIX->micVol;
            _weightFIX->activeSpeech = 0;
            _weightFIX->Rxx16_LPw32Max = 0;
          }
        }
        else if (_weightFIX->upperLimit < _weightFIX->Rxx160_LPw32) {
          _weightFIX->msTooHigh = _weightFIX->msTooHigh + 2;
          _weightFIX->msTooLow = 0;
          _weightFIX->changeToSlowMode = 0;
          if (_weightFIX->msecSpeechInnerChange < _weightFIX->msTooHigh) {
            _weightFIX->msTooHigh = 0;
            _weightFIX->Rxx160_LPw32 = (_weightFIX->Rxx160_LPw32 / 0x40) * 0x35;
            _weightFIX->maxLevel = (_weightFIX->maxLevel * 0xf + _weightFIX->micVol) / 0x10;
            if (_weightFIX->maxAnalog < _weightFIX->maxLevel) {
              local_70 = _weightFIX->maxLevel;
            }
            else {
              local_70 = _weightFIX->maxAnalog;
            }
            _weightFIX->maxLevel = local_70;
            _weightFIX->zeroCtrlMax = _weightFIX->micVol;
            tmp32 = (iStack_48 - _weightFIX->minLevel) * 0x7b85;
            _weightFIX->micVol = ((uint)tmp32 >> 0xf) + _weightFIX->minLevel;
            if (stt._4_4_ + -1 < _weightFIX->micVol) {
              _weightFIX->micVol = stt._4_4_ + -1;
            }
            iStack_48 = _weightFIX->micVol;
          }
        }
        else if (_weightFIX->Rxx160_LPw32 < _weightFIX->lowerSecondaryLimit) {
          _weightFIX->msTooHigh = 0;
          _weightFIX->changeToSlowMode = 0;
          _weightFIX->msTooLow = _weightFIX->msTooLow + 2;
          if (_weightFIX->msecSpeechOuterChange < _weightFIX->msTooLow) {
            local_62 = 0x4000;
            _weightFIX->msTooLow = 0;
            lastMicVol = (iStack_48 - _weightFIX->minLevel) * 0x4000;
            if (_weightFIX->maxInit != _weightFIX->minLevel) {
              local_62 = (int16_t)(lastMicVol / (_weightFIX->maxInit - _weightFIX->minLevel));
            }
            WebRtcAgc_ExpCurve(local_62,&weightFIX_1);
            volNormFIX_1 = kOffset1[weightFIX_1] -
                           (short)((int)kSlope1[weightFIX_1] * (int)local_62 >> 0xd);
            _weightFIX->Rxx160_LPw32 = (_weightFIX->Rxx160_LPw32 / 0x40) * 0x43;
            tmp32 = (int)volNormFIX_1 * (iStack_48 - _weightFIX->minLevel);
            _weightFIX->micVol = ((uint)tmp32 >> 0xe) + _weightFIX->minLevel;
            if (_weightFIX->micVol < stt._4_4_ + 2) {
              _weightFIX->micVol = stt._4_4_ + 2;
            }
            iStack_48 = _weightFIX->micVol;
          }
        }
        else if (_weightFIX->Rxx160_LPw32 < _weightFIX->lowerLimit) {
          _weightFIX->msTooHigh = 0;
          _weightFIX->changeToSlowMode = 0;
          _weightFIX->msTooLow = _weightFIX->msTooLow + 2;
          if (_weightFIX->msecSpeechInnerChange < _weightFIX->msTooLow) {
            local_68 = 0x4000;
            _weightFIX->msTooLow = 0;
            lastMicVol = (iStack_48 - _weightFIX->minLevel) * 0x4000;
            if (_weightFIX->maxInit != _weightFIX->minLevel) {
              local_68 = (int16_t)(lastMicVol / (_weightFIX->maxInit - _weightFIX->minLevel));
            }
            WebRtcAgc_ExpCurve(local_68,&local_64);
            sVar1 = kOffset2[local_64];
            sVar2 = kSlope2[local_64];
            _weightFIX->Rxx160_LPw32 = (_weightFIX->Rxx160_LPw32 / 0x40) * 0x43;
            tmp32 = (int)(short)(sVar1 - (short)((int)sVar2 * (int)local_68 >> 0xd)) *
                    (iStack_48 - _weightFIX->minLevel);
            _weightFIX->micVol = ((uint)tmp32 >> 0xe) + _weightFIX->minLevel;
            if (_weightFIX->micVol < stt._4_4_ + 1) {
              _weightFIX->micVol = stt._4_4_ + 1;
            }
            iStack_48 = _weightFIX->micVol;
          }
        }
        else {
          if (_weightFIX->changeToSlowMode < 0xfa1) {
            _weightFIX->changeToSlowMode = _weightFIX->changeToSlowMode + 2;
          }
          else {
            _weightFIX->msecSpeechInnerChange = 1000;
            _weightFIX->msecSpeechOuterChange = 500;
            _weightFIX->upperLimit = _weightFIX->upperPrimaryLimit;
            _weightFIX->lowerLimit = _weightFIX->lowerPrimaryLimit;
          }
          _weightFIX->msTooLow = 0;
          _weightFIX->msTooHigh = 0;
          _weightFIX->micVol = iStack_48;
        }
      }
    }
    if (((saturationWarning_local._4_2_ == 1) ||
        ((0 < _weightFIX->muteGuardMs && (_weightFIX->muteGuardMs < 8000)))) &&
       (stt._4_4_ < _weightFIX->micVol)) {
      _weightFIX->micVol = stt._4_4_;
    }
    if (_weightFIX->maxLevel < _weightFIX->micVol) {
      _weightFIX->micVol = _weightFIX->maxLevel;
    }
    else if (_weightFIX->micVol < _weightFIX->minOutput) {
      _weightFIX->micVol = _weightFIX->minOutput;
    }
    if (_weightFIX->micVol < _weightFIX->maxAnalog) {
      local_74 = _weightFIX->micVol;
    }
    else {
      local_74 = _weightFIX->maxAnalog;
    }
    *piStack_28 = local_74 >> ((byte)_weightFIX->scale & 0x1f);
    state_local._4_4_ = 0;
  }
  return state_local._4_4_;
}

Assistant:

int32_t WebRtcAgc_ProcessAnalog(void *state, int32_t inMicLevel, int32_t *outMicLevel, int16_t vadLogRatio,
                                int16_t echo, uint8_t *saturationWarning) {
    uint32_t tmpU32;
    int32_t Rxx16w32, tmp32;
    int32_t inMicLevelTmp, lastMicVol;
    int16_t i;
    uint8_t saturated = 0;
    LegacyAgc *stt;

    stt = (LegacyAgc *) state;
    inMicLevelTmp = inMicLevel << stt->scale;

    if (inMicLevelTmp > stt->maxAnalog) {
#ifdef WEBRTC_AGC_DEBUG_DUMP
        fprintf(stt->fpt, "\tAGC->ProcessAnalog, frame %d: micLvl > maxAnalog\n", stt->fcount);
#endif
        return -1;
    } else if (inMicLevelTmp < stt->minLevel) {
#ifdef WEBRTC_AGC_DEBUG_DUMP
        fprintf(stt->fpt, "\tAGC->ProcessAnalog, frame %d: micLvl < minLevel\n", stt->fcount);
#endif
        return -1;
    }

    if (stt->firstCall == 0) {
        int32_t tmpVol;
        stt->firstCall = 1;
        tmp32 = ((stt->maxLevel - stt->minLevel) * 51) >> 9;
        tmpVol = (stt->minLevel + tmp32);

        /* If the mic level is very low at start, increase it! */
        if ((inMicLevelTmp < tmpVol) && (stt->agcMode == kAgcModeAdaptiveAnalog)) {
            inMicLevelTmp = tmpVol;
        }
        stt->micVol = inMicLevelTmp;
    }

    /* Set the mic level to the previous output value if there is digital input
     * gain */
    if ((inMicLevelTmp == stt->maxAnalog) && (stt->micVol > stt->maxAnalog)) {
        inMicLevelTmp = stt->micVol;
    }

    /* If the mic level was manually changed to a very low value raise it! */
    if ((inMicLevelTmp != stt->micVol) && (inMicLevelTmp < stt->minOutput)) {
        tmp32 = ((stt->maxLevel - stt->minLevel) * 51) >> 9;
        inMicLevelTmp = (stt->minLevel + tmp32);
        stt->micVol = inMicLevelTmp;
#ifdef MIC_LEVEL_FEEDBACK
        // stt->numBlocksMicLvlSat = 0;
#endif
#ifdef WEBRTC_AGC_DEBUG_DUMP
        fprintf(stt->fpt,
                "\tAGC->ProcessAnalog, frame %d: micLvl < minLevel by manual"
                " decrease, raise vol\n",
                stt->fcount);
#endif
    }

    if (inMicLevelTmp != stt->micVol) {
        if (inMicLevel == stt->lastInMicLevel) {
            // We requested a volume adjustment, but it didn't occur. This is
            // probably due to a coarse quantization of the volume slider.
            // Restore the requested value to prevent getting stuck.
            inMicLevelTmp = stt->micVol;
        } else {
            // As long as the value changed, update to match.
            stt->micVol = inMicLevelTmp;
        }
    }

    if (inMicLevelTmp > stt->maxLevel) {
        // Always allow the user to raise the volume above the maxLevel.
        stt->maxLevel = inMicLevelTmp;
    }

    // Store last value here, after we've taken care of manual updates etc.
    stt->lastInMicLevel = inMicLevel;
    lastMicVol = stt->micVol;

    /* Checks if the signal is saturated. Also a check if individual samples
     * are larger than 12000 is done. If they are the counter for increasing
     * the volume level is set to -100ms
     */
    WebRtcAgc_SaturationCtrl(stt, &saturated, stt->env[0]);

    /* The AGC is always allowed to lower the level if the signal is saturated */
    if (saturated == 1) {
        /* Lower the recording level
         * Rxx160_LP is adjusted down because it is so slow it could
         * cause the AGC to make wrong decisions. */
        /* stt->Rxx160_LPw32 *= 0.875; */
        stt->Rxx160_LPw32 = (stt->Rxx160_LPw32 / 8) * 7;

        stt->zeroCtrlMax = stt->micVol;

        /* stt->micVol *= 0.903; */
        tmp32 = inMicLevelTmp - stt->minLevel;
        tmpU32 = ((uint32_t)((uint32_t)(29591) * (uint32_t)(tmp32)));
        stt->micVol = (tmpU32 >> 15) + stt->minLevel;
        if (stt->micVol > lastMicVol - 2) {
            stt->micVol = lastMicVol - 2;
        }
        inMicLevelTmp = stt->micVol;

#ifdef WEBRTC_AGC_DEBUG_DUMP
        fprintf(stt->fpt, "\tAGC->ProcessAnalog, frame %d: saturated, micVol = %d\n", stt->fcount, stt->micVol);
#endif

        if (stt->micVol < stt->minOutput) {
            *saturationWarning = 1;
        }

        /* Reset counter for decrease of volume level to avoid
         * decreasing too much. The saturation control can still
         * lower the level if needed. */
        stt->msTooHigh = -100;

        /* Enable the control mechanism to ensure that our measure,
         * Rxx160_LP, is in the correct range. This must be done since
         * the measure is very slow. */
        stt->activeSpeech = 0;
        stt->Rxx16_LPw32Max = 0;

        /* Reset to initial values */
        stt->msecSpeechInnerChange = kMsecSpeechInner;
        stt->msecSpeechOuterChange = kMsecSpeechOuter;
        stt->changeToSlowMode = 0;

        stt->muteGuardMs = 0;

        stt->upperLimit = stt->startUpperLimit;
        stt->lowerLimit = stt->startLowerLimit;
#ifdef MIC_LEVEL_FEEDBACK
        // stt->numBlocksMicLvlSat = 0;
#endif
    }

    /* Check if the input speech is zero. If so the mic volume
     * is increased. On some computers the input is zero up as high
     * level as 17% */
    WebRtcAgc_ZeroCtrl(stt, &inMicLevelTmp, stt->env[0]);

    /* Check if the near end speaker is inactive.
     * If that is the case the VAD threshold is
     * increased since the VAD speech model gets
     * more sensitive to any sound after a long
     * silence.
     */
    WebRtcAgc_SpeakerInactiveCtrl(stt);

    for (i = 0; i < 5; i++) {
        /* Computed on blocks of 16 samples */

        Rxx16w32 = stt->Rxx16w32_array[0][i];

        /* Rxx160w32 in Q(-7) */
        tmp32 = (Rxx16w32 - stt->Rxx16_vectorw32[stt->Rxx16pos]) >> 3;
        stt->Rxx160w32 = stt->Rxx160w32 + tmp32;
        stt->Rxx16_vectorw32[stt->Rxx16pos] = Rxx16w32;

        /* Circular buffer */
        stt->Rxx16pos++;
        if (stt->Rxx16pos == RXX_BUFFER_LEN) {
            stt->Rxx16pos = 0;
        }

        /* Rxx16_LPw32 in Q(-4) */
        tmp32 = (Rxx16w32 - stt->Rxx16_LPw32) >> kAlphaShortTerm;
        stt->Rxx16_LPw32 = (stt->Rxx16_LPw32) + tmp32;

        if (vadLogRatio > stt->vadThreshold) {
            /* Speech detected! */

            /* Check if Rxx160_LP is in the correct range. If
             * it is too high/low then we set it to the maximum of
             * Rxx16_LPw32 during the first 200ms of speech.
             */
            if (stt->activeSpeech < 250) {
                stt->activeSpeech += 2;

                if (stt->Rxx16_LPw32 > stt->Rxx16_LPw32Max) {
                    stt->Rxx16_LPw32Max = stt->Rxx16_LPw32;
                }
            } else if (stt->activeSpeech == 250) {
                stt->activeSpeech += 2;
                tmp32 = stt->Rxx16_LPw32Max >> 3;
                stt->Rxx160_LPw32 = tmp32 * RXX_BUFFER_LEN;
            }

            tmp32 = (stt->Rxx160w32 - stt->Rxx160_LPw32) >> kAlphaLongTerm;
            stt->Rxx160_LPw32 = stt->Rxx160_LPw32 + tmp32;

            if (stt->Rxx160_LPw32 > stt->upperSecondaryLimit) {
                stt->msTooHigh += 2;
                stt->msTooLow = 0;
                stt->changeToSlowMode = 0;

                if (stt->msTooHigh > stt->msecSpeechOuterChange) {
                    stt->msTooHigh = 0;

                    /* Lower the recording level */
                    /* Multiply by 0.828125 which corresponds to decreasing ~0.8dB */
                    tmp32 = stt->Rxx160_LPw32 >> 6;
                    stt->Rxx160_LPw32 = tmp32 * 53;

                    /* Reduce the max gain to avoid excessive oscillation
                     * (but never drop below the maximum analog level).
                     */
                    stt->maxLevel = (15 * stt->maxLevel + stt->micVol) / 16;
                    stt->maxLevel = MAX(stt->maxLevel, stt->maxAnalog);

                    stt->zeroCtrlMax = stt->micVol;

                    /* 0.95 in Q15 */
                    tmp32 = inMicLevelTmp - stt->minLevel;
                    tmpU32 = ((uint32_t)((uint32_t)(31130) * (uint32_t)(tmp32)));
                    stt->micVol = (tmpU32 >> 15) + stt->minLevel;
                    if (stt->micVol > lastMicVol - 1) {
                        stt->micVol = lastMicVol - 1;
                    }
                    inMicLevelTmp = stt->micVol;

                    /* Enable the control mechanism to ensure that our measure,
                     * Rxx160_LP, is in the correct range.
                     */
                    stt->activeSpeech = 0;
                    stt->Rxx16_LPw32Max = 0;
#ifdef MIC_LEVEL_FEEDBACK
                    // stt->numBlocksMicLvlSat = 0;
#endif
#ifdef WEBRTC_AGC_DEBUG_DUMP
                    fprintf(stt->fpt,
                            "\tAGC->ProcessAnalog, frame %d: measure >"
                            " 2ndUpperLim, micVol = %d, maxLevel = %d\n",
                            stt->fcount, stt->micVol, stt->maxLevel);
#endif
                }
            } else if (stt->Rxx160_LPw32 > stt->upperLimit) {
                stt->msTooHigh += 2;
                stt->msTooLow = 0;
                stt->changeToSlowMode = 0;

                if (stt->msTooHigh > stt->msecSpeechInnerChange) {
                    /* Lower the recording level */
                    stt->msTooHigh = 0;
                    /* Multiply by 0.828125 which corresponds to decreasing ~0.8dB */
                    stt->Rxx160_LPw32 = (stt->Rxx160_LPw32 / 64) * 53;

                    /* Reduce the max gain to avoid excessive oscillation
                     * (but never drop below the maximum analog level).
                     */
                    stt->maxLevel = (15 * stt->maxLevel + stt->micVol) / 16;
                    stt->maxLevel = MAX(stt->maxLevel, stt->maxAnalog);

                    stt->zeroCtrlMax = stt->micVol;

                    /* 0.965 in Q15 */
                    // tmp32 = inMicLevelTmp - stt->minLevel;
                    tmpU32 = ((uint32_t)((uint32_t)(31621) * (uint32_t)((inMicLevelTmp - stt->minLevel))));
                    stt->micVol = (tmpU32 >> 15) + stt->minLevel;
                    if (stt->micVol > lastMicVol - 1) {
                        stt->micVol = lastMicVol - 1;
                    }
                    inMicLevelTmp = stt->micVol;

#ifdef MIC_LEVEL_FEEDBACK
                    // stt->numBlocksMicLvlSat = 0;
#endif
#ifdef WEBRTC_AGC_DEBUG_DUMP
                    fprintf(stt->fpt,
                            "\tAGC->ProcessAnalog, frame %d: measure >"
                            " UpperLim, micVol = %d, maxLevel = %d\n",
                            stt->fcount, stt->micVol, stt->maxLevel);
#endif
                }
            } else if (stt->Rxx160_LPw32 < stt->lowerSecondaryLimit) {
                stt->msTooHigh = 0;
                stt->changeToSlowMode = 0;
                stt->msTooLow += 2;

                if (stt->msTooLow > stt->msecSpeechOuterChange) {
                    /* Raise the recording level */
                    int16_t index, weightFIX;
                    int16_t volNormFIX = 16384;  // =1 in Q14.

                    stt->msTooLow = 0;

                    /* Normalize the volume level */
                    tmp32 = (inMicLevelTmp - stt->minLevel) << 14;
                    if (stt->maxInit != stt->minLevel) {
                        volNormFIX = tmp32 / (stt->maxInit - stt->minLevel);
                    }

                    /* Find correct curve */
                    WebRtcAgc_ExpCurve(volNormFIX, &index);

                    /* Compute weighting factor for the volume increase, 32^(-2*X)/2+1.05
                     */
                    weightFIX = kOffset1[index] - (int16_t) ((kSlope1[index] * volNormFIX) >> 13);

                    /* stt->Rxx160_LPw32 *= 1.047 [~0.2 dB]; */
                    stt->Rxx160_LPw32 = (stt->Rxx160_LPw32 / 64) * 67;

                    // tmp32 = inMicLevelTmp - stt->minLevel;
                    tmpU32 = ((uint32_t) weightFIX * (uint32_t)(inMicLevelTmp - stt->minLevel));
                    stt->micVol = (tmpU32 >> 14) + stt->minLevel;
                    if (stt->micVol < lastMicVol + 2) {
                        stt->micVol = lastMicVol + 2;
                    }

                    inMicLevelTmp = stt->micVol;

#ifdef MIC_LEVEL_FEEDBACK
                    /* Count ms in level saturation */
                    // if (stt->micVol > stt->maxAnalog) {
                    if (stt->micVol > 150) {
                        /* mic level is saturated */
                        stt->numBlocksMicLvlSat++;
                        fprintf(stderr, "Sat mic Level: %d\n", stt->numBlocksMicLvlSat);
                    }
#endif
#ifdef WEBRTC_AGC_DEBUG_DUMP
                    fprintf(stt->fpt,
                            "\tAGC->ProcessAnalog, frame %d: measure <"
                            " 2ndLowerLim, micVol = %d\n",
                            stt->fcount, stt->micVol);
#endif
                }
            } else if (stt->Rxx160_LPw32 < stt->lowerLimit) {
                stt->msTooHigh = 0;
                stt->changeToSlowMode = 0;
                stt->msTooLow += 2;

                if (stt->msTooLow > stt->msecSpeechInnerChange) {
                    /* Raise the recording level */
                    int16_t index, weightFIX;
                    int16_t volNormFIX = 16384;  // =1 in Q14.

                    stt->msTooLow = 0;

                    /* Normalize the volume level */
                    tmp32 = (inMicLevelTmp - stt->minLevel) << 14;
                    if (stt->maxInit != stt->minLevel) {
                        volNormFIX = tmp32 / (stt->maxInit - stt->minLevel);
                    }

                    /* Find correct curve */
                    WebRtcAgc_ExpCurve(volNormFIX, &index);

                    /* Compute weighting factor for the volume increase, (3.^(-2.*X))/8+1
                     */
                    weightFIX = kOffset2[index] - (int16_t) ((kSlope2[index] * volNormFIX) >> 13);

                    /* stt->Rxx160_LPw32 *= 1.047 [~0.2 dB]; */
                    stt->Rxx160_LPw32 = (stt->Rxx160_LPw32 / 64) * 67;

                    //   tmp32 = inMicLevelTmp - stt->minLevel;
                    tmpU32 = ((uint32_t) weightFIX * (uint32_t)(inMicLevelTmp - stt->minLevel));
                    stt->micVol = (tmpU32 >> 14) + stt->minLevel;
                    if (stt->micVol < lastMicVol + 1) {
                        stt->micVol = lastMicVol + 1;
                    }

                    inMicLevelTmp = stt->micVol;

#ifdef MIC_LEVEL_FEEDBACK
                    /* Count ms in level saturation */
                    // if (stt->micVol > stt->maxAnalog) {
                    if (stt->micVol > 150) {
                        /* mic level is saturated */
                        stt->numBlocksMicLvlSat++;
                        fprintf(stderr, "Sat mic Level: %d\n", stt->numBlocksMicLvlSat);
                    }
#endif
#ifdef WEBRTC_AGC_DEBUG_DUMP
                    fprintf(stt->fpt,
                            "\tAGC->ProcessAnalog, frame %d: measure < LowerLim, micVol "
                            "= %d\n",
                            stt->fcount, stt->micVol);
#endif
                }
            } else {
                /* The signal is inside the desired range which is:
                 * lowerLimit < Rxx160_LP/640 < upperLimit
                 */
                if (stt->changeToSlowMode > 4000) {
                    stt->msecSpeechInnerChange = 1000;
                    stt->msecSpeechOuterChange = 500;
                    stt->upperLimit = stt->upperPrimaryLimit;
                    stt->lowerLimit = stt->lowerPrimaryLimit;
                } else {
                    stt->changeToSlowMode += 2;  // in milliseconds
                }
                stt->msTooLow = 0;
                stt->msTooHigh = 0;

                stt->micVol = inMicLevelTmp;
            }
#ifdef MIC_LEVEL_FEEDBACK
            if (stt->numBlocksMicLvlSat > NUM_BLOCKS_IN_SAT_BEFORE_CHANGE_TARGET) {
                stt->micLvlSat = 1;
                fprintf(stderr, "target before = %d (%d)\n", stt->analogTargetLevel, stt->targetIdx);
                WebRtcAgc_UpdateAgcThresholds(stt);
                WebRtcAgc_CalculateGainTable(&(stt->digitalAgc.gainTable[0]), stt->compressionGaindB,
                                             stt->targetLevelDbfs, stt->limiterEnable, stt->analogTarget);
                stt->numBlocksMicLvlSat = 0;
                stt->micLvlSat = 0;
                fprintf(stderr, "target offset = %d\n", stt->targetIdxOffset);
                fprintf(stderr, "target after  = %d (%d)\n", stt->analogTargetLevel, stt->targetIdx);
            }
#endif
        }
    }

    /* Ensure gain is not increased in presence of echo or after a mute event
     * (but allow the zeroCtrl() increase on the frame of a mute detection).
     */
    if (echo == 1 || (stt->muteGuardMs > 0 && stt->muteGuardMs < kMuteGuardTimeMs)) {
        if (stt->micVol > lastMicVol) {
            stt->micVol = lastMicVol;
        }
    }

    /* limit the gain */
    if (stt->micVol > stt->maxLevel) {
        stt->micVol = stt->maxLevel;
    } else if (stt->micVol < stt->minOutput) {
        stt->micVol = stt->minOutput;
    }

    *outMicLevel = MIN(stt->micVol, stt->maxAnalog) >> stt->scale;

    return 0;
}